

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O2

void __thiscall Markov::Connection::TrainFinal(Connection *this,string_view src,TrainData *td)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> __args;
  sviterator iter;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> rStack_138;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_b0;
  
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  regex_token_iterator(&rStack_138,src._M_str,src._M_str + src._M_len,&td->iter,0,0);
  while (bVar2 = std::__cxx11::
                 regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                 operator!=(&rStack_138,&td->badIter), bVar2) {
    pcVar3 = ((rStack_138._M_result)->super_pair<const_char_*,_const_char_*>).first;
    pcVar1 = ((rStack_138._M_result)->super_pair<const_char_*,_const_char_*>).second + -(long)pcVar3
    ;
    if (((rStack_138._M_result)->matched & 1U) == 0) {
      pcVar3 = (char *)0x0;
      pcVar1 = (char *)0x0;
    }
    __args._M_str = pcVar3;
    __args._M_len = (size_t)pcVar1;
    std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
              (&td->func,__args,false);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    operator++(&local_b0,&rStack_138,0);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_token_iterator(&local_b0);
  }
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  ~regex_token_iterator(&rStack_138);
  return;
}

Assistant:

void Connection::TrainFinal(std::string_view src, const TrainData& td) {
		for (auto iter = sviterator(src.begin(), src.end(), td.iter); iter != td.badIter; iter++) {
				td.func(matchToSv(*iter), false);
				}
		}